

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

llm_graph_input_attn_kv_unified * __thiscall
llm_graph_context::build_attn_inp_kv_unified(llm_graph_context *this)

{
  ggml_tensor *pgVar1;
  pointer plVar2;
  pointer input;
  llm_graph_input_attn_kv_unified *plVar3;
  long in_RDI;
  uint32_t n_kv;
  __single_object inp;
  llama_kv_cache_unified *kv_self;
  llm_graph_result *this_00;
  unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
  *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  llama_kv_cache_unified **in_stack_ffffffffffffff68;
  llama_cparams *in_stack_ffffffffffffff70;
  undefined8 uVar4;
  llama_hparams *in_stack_ffffffffffffff78;
  ggml_tensor *local_68;
  llm_graph_result local_38;
  
  local_38.inputs.
  super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(in_RDI + 0xe8);
  std::
  make_unique<llm_graph_input_attn_kv_unified,llama_hparams_const&,llama_cparams_const&,llama_kv_cache_unified_const*&>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_38.t_embd_pooled._4_4_ =
       *(undefined4 *)
        ((long)&local_38.inputs.
                super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[0xe]._M_t.
                super___uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>.
                _M_t.
                super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 4);
  pgVar1 = (ggml_tensor *)
           ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,local_38.t_embd_pooled._4_4_,
                              (long)(int)(*(int *)(in_RDI + 0xa8) + 0x3fU & 0xffffffc0));
  plVar2 = std::
           unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
           ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                         *)0x435fae);
  plVar2->self_kq_mask = pgVar1;
  plVar2 = std::
           unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
           ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                         *)0x435fc1);
  ggml_set_input(plVar2->self_kq_mask);
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3b) & 1) == 0) {
    plVar2 = std::
             unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
             ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                           *)0x43602c);
    local_68 = plVar2->self_kq_mask;
  }
  else {
    uVar4 = *(undefined8 *)(in_RDI + 0xc0);
    plVar2 = std::
             unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
             ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                           *)0x435ff9);
    local_68 = (ggml_tensor *)ggml_cast(uVar4,plVar2->self_kq_mask,1);
  }
  plVar2 = std::
           unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
           ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                         *)0x43604c);
  plVar2->self_kq_mask_cnv = local_68;
  if (1 < *(uint *)(*(long *)(in_RDI + 8) + 0x1c)) {
    if (*(int *)(*(long *)(in_RDI + 8) + 0x18) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x55f,"GGML_ASSERT(%s) failed","hparams.n_swa > 0");
    }
    pgVar1 = (ggml_tensor *)
             ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,local_38.t_embd_pooled._4_4_,
                                (long)(int)(*(int *)(in_RDI + 0xa8) + 0x3fU & 0xffffffc0));
    plVar2 = std::
             unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
             ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                           *)0x4360fa);
    plVar2->self_kq_mask_swa = pgVar1;
    plVar2 = std::
             unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
             ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                           *)0x43610d);
    ggml_set_input(plVar2->self_kq_mask_swa);
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3b) & 1) == 0) {
      plVar2 = std::
               unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
               ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                             *)0x436178);
      in_stack_ffffffffffffff60 = plVar2->self_kq_mask_swa;
    }
    else {
      uVar4 = *(undefined8 *)(in_RDI + 0xc0);
      plVar2 = std::
               unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
               ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                             *)0x436145);
      in_stack_ffffffffffffff60 = (ggml_tensor *)ggml_cast(uVar4,plVar2->self_kq_mask_swa,1);
    }
    plVar2 = std::
             unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
             ::operator->((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                           *)0x436198);
    plVar2->self_kq_mask_swa_cnv = in_stack_ffffffffffffff60;
  }
  input = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                    ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                     0x4361b2);
  this_00 = &local_38;
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_attn_kv_unified,std::default_delete<llm_graph_input_attn_kv_unified>,void>
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  plVar3 = (llm_graph_input_attn_kv_unified *)
           llm_graph_result::add_input(this_00,(llm_graph_input_ptr *)input);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00);
  std::
  unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
  ::~unique_ptr((unique_ptr<llm_graph_input_attn_kv_unified,_std::default_delete<llm_graph_input_attn_kv_unified>_>
                 *)this_00);
  return plVar3;
}

Assistant:

llm_graph_input_attn_kv_unified * llm_graph_context::build_attn_inp_kv_unified() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_attn_kv_unified>(hparams, cparams, kv_self);

    const auto n_kv = kv_self->n;

    inp->self_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    //cb(inp->self_kq_mask, "KQ_mask", -1);
    ggml_set_input(inp->self_kq_mask);

    inp->self_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask, GGML_TYPE_F16) : inp->self_kq_mask;

    if (hparams.n_swa_pattern > 1) {
        GGML_ASSERT(hparams.n_swa > 0);

        inp->self_kq_mask_swa = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
        //cb(inp->self_kq_mask_swa, "KQ_mask_swa", -1);
        ggml_set_input(inp->self_kq_mask_swa);

        inp->self_kq_mask_swa_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask_swa, GGML_TYPE_F16) : inp->self_kq_mask_swa;
    }

    return (llm_graph_input_attn_kv_unified *) res->add_input(std::move(inp));
}